

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_writemap.cpp
# Opt level: O0

int WriteVERTEXES(FILE *file)

{
  fixed_t fVar1;
  int local_18;
  undefined2 local_14;
  undefined2 local_12;
  int i;
  mapvertex_t mv;
  FILE *file_local;
  
  _i = (FILE *)file;
  for (local_18 = 0; local_18 < numvertexes; local_18 = local_18 + 1) {
    fVar1 = vertex_t::fixX(vertexes + local_18);
    local_14 = (undefined2)((uint)fVar1 >> 0x10);
    fVar1 = vertex_t::fixY(vertexes + local_18);
    local_12 = (undefined2)((uint)fVar1 >> 0x10);
    fwrite(&local_14,4,1,_i);
  }
  return numvertexes << 2;
}

Assistant:

static int WriteVERTEXES (FILE *file)
{
	mapvertex_t mv;

	for (int i = 0; i < numvertexes; ++i)
	{
		mv.x = LittleShort(short(vertexes[i].fixX() >> FRACBITS));
		mv.y = LittleShort(short(vertexes[i].fixY() >> FRACBITS));
		fwrite (&mv, sizeof(mv), 1, file);
	}
	return numvertexes * sizeof(mv);
}